

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

U32 ZSTD_resolveRepcodeToRawOffset(U32 *rep,U32 offBase,U32 ll0)

{
  uint uVar1;
  int in_EDX;
  uint in_ESI;
  int *in_RDI;
  U32 adjustedRepCode;
  U32 local_4;
  
  if ((in_ESI == 0) || (3 < in_ESI)) {
    __assert_fail("OFFBASE_IS_REPCODE(offBase)",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x5fe1,"U32 ZSTD_resolveRepcodeToRawOffset(const U32 *, const U32, const U32)");
  }
  uVar1 = (in_ESI - 1) + in_EDX;
  if ((in_ESI != 0) && (in_ESI < 4)) {
    if (uVar1 == 3) {
      if (in_EDX == 0) {
        __assert_fail("ll0",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x5fe4,
                      "U32 ZSTD_resolveRepcodeToRawOffset(const U32 *, const U32, const U32)");
      }
      local_4 = *in_RDI - 1;
    }
    else {
      local_4 = in_RDI[uVar1];
    }
    return local_4;
  }
  __assert_fail("OFFBASE_IS_REPCODE(offBase)",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                ,0x5fe2,"U32 ZSTD_resolveRepcodeToRawOffset(const U32 *, const U32, const U32)");
}

Assistant:

static U32
ZSTD_resolveRepcodeToRawOffset(const U32 rep[ZSTD_REP_NUM], const U32 offBase, const U32 ll0)
{
    U32 const adjustedRepCode = OFFBASE_TO_REPCODE(offBase) - 1 + ll0;  /* [ 0 - 3 ] */
    assert(OFFBASE_IS_REPCODE(offBase));
    if (adjustedRepCode == ZSTD_REP_NUM) {
        assert(ll0);
        /* litlength == 0 and offCode == 2 implies selection of first repcode - 1
         * This is only valid if it results in a valid offset value, aka > 0.
         * Note : it may happen that `rep[0]==1` in exceptional circumstances.
         * In which case this function will return 0, which is an invalid offset.
         * It's not an issue though, since this value will be
         * compared and discarded within ZSTD_seqStore_resolveOffCodes().
         */
        return rep[0] - 1;
    }
    return rep[adjustedRepCode];
}